

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  cpp_dec_float<50U,_int,_void> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int idx;
  int enterIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pen;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *test;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 local_234 [8];
  int in_stack_fffffffffffffdd4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd8;
  undefined1 local_1fc [56];
  undefined1 local_1c4 [12];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe58;
  undefined1 local_18c [56];
  undefined1 local_154 [56];
  uint local_11c;
  undefined1 local_118 [56];
  int local_e0;
  int local_dc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined8 local_c0;
  DataKey local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  fpclass_type *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<50U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_c0 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           **)((in_RDI->data)._M_elems + 4));
  local_d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x378911);
  local_d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x378931);
  local_dc = -1;
  local_a8 = local_118;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
  local_11c = IdxSet::size((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xc98));
  uVar4 = extraout_RDX;
  while (local_11c = local_11c - 1, -1 < (int)local_11c) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xc98),
                           (char *)(ulong)local_11c,(int)uVar4);
    local_e0 = (int)pcVar2;
    local_40 = local_d0 + local_e0;
    local_38 = local_118;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RDX);
    local_20 = local_154;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_154;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
    local_8 = local_154;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_RDX,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x378a8d);
    if (tVar1) {
      local_98 = local_1c4;
      local_a0 = local_118;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_90 = local_d8 + local_e0;
      local_88 = local_1fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_78 = local_234;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_68 = local_118;
      local_70 = local_18c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RDX);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_RDX,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x378ba3);
      uVar4 = extraout_RDX_00;
      if (tVar1) {
        local_48 = local_c0;
        local_50 = local_118;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RDX);
        local_dc = local_e0;
        local_60 = local_d8 + local_e0;
        local_58 = &in_RDI[1].fpclass;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RDX);
        uVar4 = extraout_RDX_01;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xc98),
                     (char *)(ulong)local_11c);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xd10),
                          local_e0);
      *piVar3 = 0;
      uVar4 = extraout_RDX_02;
    }
  }
  if (local_dc < 0) {
    SPxId::SPxId((SPxId *)0x378cc2);
  }
  else {
    local_b0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
  }
  return (SPxId)local_b0;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}